

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIPS.cpp
# Opt level: O3

double getStepLength(Mesh *mesh,VectorXd *params,VectorXd *p,VectorXd *grad,double *epsilon,
                    double alpha0)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double *pdVar4;
  double *pdVar5;
  Scalar SVar6;
  double dVar7;
  bool bVar8;
  ostream *poVar9;
  Scalar *pSVar10;
  long lVar11;
  Scalar *pSVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  scalar_sum_op<double,_double> local_a9;
  undefined1 local_a8 [16];
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_98;
  double local_68;
  double *local_60;
  double local_58;
  double local_50;
  XprType local_48;
  
  local_a8._8_4_ = in_XMM0_Dc;
  local_a8._0_8_ = alpha0;
  local_a8._12_4_ = in_XMM0_Dd;
  local_60 = epsilon;
  local_50 = getEnergy(mesh,params,*epsilon,false);
  local_98.m_evaluator.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  ._0_8_ = (double *)0x0;
  local_98.m_evaluator.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_data =
       (Scalar *)0x0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_98,
             (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows,1)
  ;
  pdVar4 = (params->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
  ;
  pdVar5 = (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  pSVar12 = (Scalar *)
            (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (local_98.m_evaluator.
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_data !=
      pSVar12) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_98,(Index)pSVar12,
               1);
    pSVar12 = local_98.m_evaluator.
              super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
              .m_lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.
              m_data;
  }
  pSVar10 = (Scalar *)((long)pSVar12 - ((long)pSVar12 >> 0x3f) & 0xfffffffffffffffe);
  if (1 < (long)pSVar12) {
    lVar11 = 0;
    do {
      pdVar1 = pdVar5 + lVar11;
      dVar7 = pdVar1[1];
      pdVar2 = pdVar4 + lVar11;
      dVar3 = pdVar2[1];
      *(double *)
       (local_98.m_evaluator.
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        ._0_8_ + lVar11 * 8) = *pdVar1 * (double)local_a8._0_8_ + *pdVar2;
      ((double *)
      (local_98.m_evaluator.
       super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
       ._0_8_ + lVar11 * 8))[1] = dVar7 * (double)local_a8._0_8_ + dVar3;
      lVar11 = lVar11 + 2;
    } while (lVar11 < (long)pSVar10);
  }
  if ((long)pSVar10 < (long)pSVar12) {
    do {
      *(double *)
       (local_98.m_evaluator.
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        ._0_8_ + pSVar10 * 8) =
           pdVar5[(long)pSVar10] * (double)local_a8._0_8_ + pdVar4[(long)pSVar10];
      pSVar10 = (Scalar *)((long)pSVar10 + 1);
    } while (pSVar12 != pSVar10);
  }
  local_58 = getEnergy(mesh,(VectorXd *)&local_98,*local_60,false);
  free((void *)local_98.m_evaluator.
               super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
               ._0_8_);
  local_48.m_lhs = p;
  local_48.m_rhs = grad;
  if ((grad->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows == 0)
  {
    uVar13 = 0;
    uVar14 = 0;
  }
  else {
    local_98.m_evaluator.
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
    .m_lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_data =
         (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_98.m_evaluator.
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
    .m_rhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_data =
         (grad->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_98.m_xpr = &local_48;
    SVar6 = Eigen::internal::
            redux_impl<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_3,_0>
            ::run(&local_98,&local_a9);
    uVar13 = SUB84(SVar6,0);
    uVar14 = (undefined4)((ulong)SVar6 >> 0x20);
  }
  local_68 = (double)CONCAT44(uVar14,uVar13);
  do {
    if (local_58 <= (double)local_a8._0_8_ * 0.0001 * local_68 + local_50) {
      local_98.m_evaluator.
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      ._0_8_ = (double *)0x0;
      local_98.m_evaluator.
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_data =
           (Scalar *)0x0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_98,
                 (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_rows,1);
      pdVar4 = (params->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      pdVar5 = (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      pSVar12 = (Scalar *)
                (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
      ;
      if (local_98.m_evaluator.
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_data
          != pSVar12) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_98,
                   (Index)pSVar12,1);
        pSVar12 = local_98.m_evaluator.
                  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                  .m_lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.
                  m_data;
      }
      pSVar10 = (Scalar *)((long)pSVar12 - ((long)pSVar12 >> 0x3f) & 0xfffffffffffffffe);
      if (1 < (long)pSVar12) {
        lVar11 = 0;
        do {
          pdVar1 = pdVar5 + lVar11;
          dVar7 = pdVar1[1];
          pdVar2 = pdVar4 + lVar11;
          dVar3 = pdVar2[1];
          *(double *)
           (local_98.m_evaluator.
            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
            ._0_8_ + lVar11 * 8) = *pdVar1 * (double)local_a8._0_8_ + *pdVar2;
          ((double *)
          (local_98.m_evaluator.
           super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
           ._0_8_ + lVar11 * 8))[1] = dVar7 * (double)local_a8._0_8_ + dVar3;
          lVar11 = lVar11 + 2;
        } while (lVar11 < (long)pSVar10);
      }
      if ((long)pSVar10 < (long)pSVar12) {
        do {
          *(double *)
           (local_98.m_evaluator.
            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
            ._0_8_ + pSVar10 * 8) =
               pdVar5[(long)pSVar10] * (double)local_a8._0_8_ + pdVar4[(long)pSVar10];
          pSVar10 = (Scalar *)((long)pSVar10 + 1);
        } while (pSVar12 != pSVar10);
      }
      bVar8 = checkCreterion(mesh,(VectorXd *)&local_98,*local_60);
      free((void *)local_98.m_evaluator.
                   super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                   ._0_8_);
      if (bVar8) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Step len: ",10);
        poVar9 = std::ostream::_M_insert<double>((double)local_a8._0_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," dphi: ",7);
        poVar9 = std::ostream::_M_insert<double>(local_68);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        return (double)local_a8._0_8_;
      }
    }
    local_a8._0_8_ = (double)local_a8._0_8_ * 0.5;
    local_98.m_evaluator.
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
    ._0_8_ = (double *)0x0;
    local_98.m_evaluator.
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
    .m_lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_data =
         (Scalar *)0x0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_98,
               (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows,
               1);
    pdVar4 = (params->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    pdVar5 = (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    pSVar12 = (Scalar *)
              (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    if (local_98.m_evaluator.
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_data !=
        pSVar12) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_98,
                 (Index)pSVar12,1);
      pSVar12 = local_98.m_evaluator.
                super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                .m_lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.
                m_data;
    }
    pSVar10 = (Scalar *)((long)pSVar12 - ((long)pSVar12 >> 0x3f) & 0xfffffffffffffffe);
    if (1 < (long)pSVar12) {
      lVar11 = 0;
      do {
        pdVar1 = pdVar5 + lVar11;
        dVar7 = pdVar1[1];
        pdVar2 = pdVar4 + lVar11;
        dVar3 = pdVar2[1];
        *(double *)
         (local_98.m_evaluator.
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          ._0_8_ + lVar11 * 8) = *pdVar1 * (double)local_a8._0_8_ + *pdVar2;
        ((double *)
        (local_98.m_evaluator.
         super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
         ._0_8_ + lVar11 * 8))[1] = dVar7 * (double)local_a8._0_8_ + dVar3;
        lVar11 = lVar11 + 2;
      } while (lVar11 < (long)pSVar10);
    }
    if ((long)pSVar10 < (long)pSVar12) {
      do {
        *(double *)
         (local_98.m_evaluator.
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          ._0_8_ + pSVar10 * 8) =
             pdVar5[(long)pSVar10] * (double)local_a8._0_8_ + pdVar4[(long)pSVar10];
        pSVar10 = (Scalar *)((long)pSVar10 + 1);
      } while (pSVar12 != pSVar10);
    }
    local_58 = getEnergy(mesh,(VectorXd *)&local_98,*local_60,false);
    free((void *)local_98.m_evaluator.
                 super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                 ._0_8_);
  } while( true );
}

Assistant:

double getStepLength(const Mesh& mesh, const Eigen::VectorXd& params, const Eigen::VectorXd& p, const Eigen::VectorXd& grad, const double& epsilon, double alpha0) {
    constexpr double c1 = 1e-4;
    double ene0 = getEnergy(mesh, params, epsilon);
    double enei = getEnergy(mesh, params + alpha0 * p, epsilon);
    double dphi = p.dot(grad);
    while (enei > ene0 + c1 * alpha0 * dphi || !checkCreterion(mesh, params + alpha0 * p, epsilon)) {
        alpha0 *= 0.50;
        enei = getEnergy(mesh, params + alpha0 * p, epsilon);
    }

#ifdef TEST
    std::cout << "Step len: " << alpha0 << " dphi: " << dphi << std::endl;
#endif
    return alpha0;
}